

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void * drwav__malloc_from_callbacks(size_t sz,drwav_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  
  if (pAllocationCallbacks != (drwav_allocation_callbacks *)0x0) {
    if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pvVar1 = (*pAllocationCallbacks->onMalloc)(sz,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
    if (pAllocationCallbacks->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      pvVar1 = (*pAllocationCallbacks->onRealloc)((void *)0x0,sz,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* drwav__malloc_from_callbacks(size_t sz, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }

    if (pAllocationCallbacks->onMalloc != NULL) {
        return pAllocationCallbacks->onMalloc(sz, pAllocationCallbacks->pUserData);
    }

    /* Try using realloc(). */
    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(NULL, sz, pAllocationCallbacks->pUserData);
    }

    return NULL;
}